

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

void __thiscall
Glucose::Clause::Clause<Glucose::Clause>(Clause *this,Clause *ps,int _extra_size,bool learnt)

{
  ulong uVar1;
  undefined7 in_register_00000009;
  int i;
  ulong uVar2;
  long lVar3;
  
  uVar2 = (ulong)((_extra_size & 3U) * 0x10 + (int)CONCAT71(in_register_00000009,learnt) * 4) |
          *(ulong *)&this->header & 0xffffffffffffff48;
  *(ulong *)&this->header = uVar2;
  uVar1 = *(ulong *)&ps->header;
  uVar2 = (uVar1 & 0xffffffff00000000) + (ulong)((uint)uVar2 & 0x80000034) + 8;
  *(ulong *)&this->header = uVar2;
  for (lVar3 = 0; lVar3 < *(int *)&(ps->header).field_0x4; lVar3 = lVar3 + 1) {
    *(undefined4 *)(&this[1].header.field_0x0 + lVar3 * 4) =
         *(undefined4 *)(&ps[1].header.field_0x0 + lVar3 * 4);
  }
  if ((_extra_size & 3U) != 0) {
    if (learnt) {
      *(undefined4 *)(&this[1].header.field_0x0 + (uVar1 >> 0x20) * 4) = 0;
    }
    else {
      calcAbstraction(this);
      uVar2 = *(ulong *)&this->header;
    }
    if ((uVar2 & 0x20) != 0) {
      *(undefined4 *)(&this[1].header.field_0x0 + (ulong)((int)(uVar2 >> 0x20) + 1) * 4) = 0;
    }
  }
  return;
}

Assistant:

Clause(const V& ps, int _extra_size, bool learnt) {
	assert(_extra_size < (1<<2));
        header.mark      = 0;
        header.learnt    = learnt;
        header.extra_size = _extra_size;
            header.reloced   = 0;
        header.size      = ps.size();
	header.lbd = 0;
	header.canbedel = 1;
	header.exported = 0; 
	header.oneWatched = 0;
	header.seen = 0;
        for (int i = 0; i < ps.size(); i++) 
            data[i].lit = ps[i];
	
        if (header.extra_size > 0){
	  if (header.learnt) 
                data[header.size].act = 0; 
            else 
                calcAbstraction();
	  if (header.extra_size > 1) {
	      data[header.size+1].abs = 0; // learntFrom
	  }	      
	}
    }